

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::PeerConnDisconnCallback::PeerConnDisconnCallback
          (PeerConnDisconnCallback *this,SubscriberStatusCallback *callback,
          SubscriberLinkPtr *sub_link,bool use_tracked_object,VoidConstWPtr *tracked_object)

{
  byte in_CL;
  shared_ptr<miniros::SubscriberLink> *in_RDI;
  shared_ptr<miniros::SubscriberLink> *in_stack_ffffffffffffffb8;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffffc8;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffffd0;
  
  CallbackInterface::CallbackInterface((CallbackInterface *)in_RDI);
  (in_RDI->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__PeerConnDisconnCallback_0061eea0;
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::shared_ptr<miniros::SubscriberLink>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  *(byte *)&in_RDI[3].super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = in_CL & 1;
  std::weak_ptr<const_void>::weak_ptr
            ((weak_ptr<const_void> *)in_RDI,(weak_ptr<const_void> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

PeerConnDisconnCallback(const SubscriberStatusCallback& callback, const SubscriberLinkPtr& sub_link, bool use_tracked_object, const VoidConstWPtr& tracked_object)
  : callback_(callback)
  , sub_link_(sub_link)
  , use_tracked_object_(use_tracked_object)
  , tracked_object_(tracked_object)
  {
  }